

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix2.c
# Opt level: O0

char * test_matrix2_transformation_scalingv2(void)

{
  int iVar1;
  float afVar2 [2];
  anon_union_8_2_12391dad_for_vector2_0 local_38;
  vector2 expectedPosition;
  vector2 scale;
  vector2 startingPosition;
  matrix2 transform;
  
  scale.field_0 =
       (anon_union_8_2_12391dad_for_vector2_0)
       (anon_struct_8_2_947311e6_for_anon_union_8_2_12391dad_for_vector2_0_1)0x3f80000000000000;
  expectedPosition.field_0 =
       (anon_union_8_2_12391dad_for_vector2_0)
       (anon_struct_8_2_947311e6_for_anon_union_8_2_12391dad_for_vector2_0_1)0x3dcccccd3dcccccd;
  local_38 = (anon_union_8_2_12391dad_for_vector2_0)0x3dcccccd00000000;
  matrix2_make_transformation_scalingv2((matrix2 *)&startingPosition,&expectedPosition);
  vector2_multiplym2(&scale,(matrix2 *)&startingPosition);
  iVar1 = vector2_equals(&scale,(vector2 *)&local_38.field_1);
  if (iVar1 == 0) {
    transform.field_0.field_1.m22[1] = (float  [2])anon_var_dwarf_50e;
  }
  else {
    transform.field_0._8_4_ = 0.0;
    transform.field_0._12_4_ = 0.0;
  }
  afVar2[0] = (float)transform.field_0._8_4_;
  afVar2[1] = (float)transform.field_0._12_4_;
  return (char *)afVar2;
}

Assistant:

static char *test_matrix2_transformation_scalingv2(void)
{
	struct matrix2 transform;

	struct vector2 startingPosition = {0.0f, 1.0f};
	struct vector2 scale = {0.1f, 0.1f};
	struct vector2 expectedPosition = {0.0f, 0.1f};

	matrix2_make_transformation_scalingv2(&transform, &scale);
	vector2_multiplym2(&startingPosition, &transform);
	test_assert(vector2_equals(&startingPosition, &expectedPosition));

	return NULL;
}